

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void binary(ch_compilation *comp)

{
  ch_parse_rule *pcVar1;
  undefined4 local_28;
  undefined4 local_24;
  ch_op op_3;
  ch_op op_2;
  ch_op op_1;
  ch_op op;
  ch_precedence_level prec;
  ch_token_kind kind;
  ch_compilation *comp_local;
  
  op = (comp->previous).kind;
  _prec = comp;
  pcVar1 = get_rule(op);
  op_1 = pcVar1->prec;
  parse(_prec,op_1 + PREC_ASSIGNMENT);
  switch(op) {
  case OP_NUMBER:
    op_2 = OP_ADD;
    ch_emit_write(&((_prec->emit).emit_scope)->bytecode,&op_2,1);
    break;
  default:
    break;
  case OP_ADD:
    op_3 = OP_SUB;
    ch_emit_write(&((_prec->emit).emit_scope)->bytecode,&op_3,1);
    break;
  case OP_SUB:
    local_24 = 10;
    ch_emit_write(&((_prec->emit).emit_scope)->bytecode,&local_24,1);
    break;
  case OP_SUBONE:
    local_28 = 0xb;
    ch_emit_write(&((_prec->emit).emit_scope)->bytecode,&local_28,1);
  }
  return;
}

Assistant:

void binary(ch_compilation *comp) {
  ch_token_kind kind = comp->previous.kind;

  ch_precedence_level prec = get_rule(kind)->prec;
  parse(comp, (ch_precedence_level)(prec + 1));

  switch (kind) {
  case TK_PLUS:
    EMIT_OP(GET_EMIT(comp), OP_ADD);
    break;
  case TK_MINUS:
    EMIT_OP(GET_EMIT(comp), OP_SUB);
    break;
  case TK_STAR:
    EMIT_OP(GET_EMIT(comp), OP_MUL);
    break;
  case TK_FSLASH:
    EMIT_OP(GET_EMIT(comp), OP_DIV);
    break;
  default:
    return;
  }
}